

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMatrix.cpp
# Opt level: O0

void __thiscall HMatrix::compute_matB_vec(HMatrix *this,double *vec,int *base,HVector *result)

{
  double dVar1;
  double dVar2;
  value_type vVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  int *in_RDI;
  int i_1;
  int k;
  double value;
  int iCol;
  int i;
  double *resultArray;
  int *resultIndex;
  int resultCount;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar8;
  undefined4 in_stack_ffffffffffffffb4;
  int iVar9;
  int local_3c;
  int local_24;
  
  HVector::clear((HVector *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  local_24 = 0;
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RCX + 8),0);
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x20),0);
  for (local_3c = 0; local_3c < in_RDI[1]; local_3c = local_3c + 1) {
    iVar8 = *(int *)(in_RDX + (long)local_3c * 4);
    dVar1 = *(double *)(in_RSI + (long)local_3c * 8);
    if (1e-14 < ABS(dVar1)) {
      if (iVar8 < *in_RDI) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),(long)iVar8);
        vVar3 = *pvVar6;
        while (iVar9 = vVar3,
              pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)(in_RDI + 2),
                                  (long)(iVar8 + 1)), vVar3 < *pvVar6) {
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)iVar9)
          ;
          dVar2 = *pvVar7;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)iVar9);
          pvVar5[*pvVar6] = dVar1 * dVar2 + pvVar5[*pvVar6];
          vVar3 = iVar9 + 1;
        }
      }
      else {
        pvVar5[iVar8 - *in_RDI] = dVar1 + pvVar5[iVar8 - *in_RDI];
      }
    }
  }
  for (iVar8 = 0; iVar8 < in_RDI[1]; iVar8 = iVar8 + 1) {
    if (ABS(pvVar5[iVar8]) <= 1e-14) {
      pvVar5[iVar8] = 0.0;
    }
    else {
      pvVar4[local_24] = iVar8;
      local_24 = local_24 + 1;
    }
  }
  *(int *)(in_RCX + 4) = local_24;
  return;
}

Assistant:

void HMatrix::compute_matB_vec(const double *vec, const int *base,
        HVector *result) {
    result->clear();
    int resultCount = 0;
    int *resultIndex = &result->index[0];
    double *resultArray = &result->array[0];

    for (int i = 0; i < numRow; i++) {
        int iCol = base[i];
        double value = vec[i];
        if (fabs(value) > HSOL_CONST_TINY) {
            if (iCol < numCol) {
                for (int k = Astart[iCol]; k < Astart[iCol + 1]; k++)
                    resultArray[Aindex[k]] += value * Avalue[k];
            } else {
                resultArray[iCol - numCol] += value;
            }
        }
    }

    for (int i = 0; i < numRow; i++) {
        if (fabs(resultArray[i]) > HSOL_CONST_TINY) {
            resultIndex[resultCount++] = i;
        } else {
            resultArray[i] = 0;
        }
    }
    result->count = resultCount;
}